

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.hpp
# Opt level: O0

string * __thiscall OpenMD::MAW::getName_abi_cxx11_(MAW *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0xa8));
  return in_RDI;
}

Assistant:

virtual string getName() { return name_; }